

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintString
          (FastFieldValuePrinter *this,string *val,BaseTextGenerator *generator)

{
  undefined8 local_30;
  undefined8 local_28;
  
  (*generator->_vptr_BaseTextGenerator[5])(generator,"\"",1);
  if (val->_M_string_length != 0) {
    absl::lts_20240722::CEscape_abi_cxx11_(&local_30,val->_M_string_length,(val->_M_dataplus)._M_p);
    (*generator->_vptr_BaseTextGenerator[5])(generator,local_30,local_28);
    std::__cxx11::string::~string((string *)&local_30);
  }
  (*generator->_vptr_BaseTextGenerator[5])(generator,"\"",1);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintString(
    const std::string& val, BaseTextGenerator* generator) const {
  generator->PrintLiteral("\"");
  if (!val.empty()) {
    generator->PrintString(absl::CEscape(val));
  }
  generator->PrintLiteral("\"");
}